

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_error_to_string(mpack_error_t error)

{
  char *pcStack_10;
  mpack_error_t error_local;
  
  switch(error) {
  case mpack_ok:
    pcStack_10 = "mpack_ok";
    break;
  default:
    break;
  case mpack_error_io:
    pcStack_10 = "mpack_error_io";
    break;
  case mpack_error_invalid:
    pcStack_10 = "mpack_error_invalid";
    break;
  case mpack_error_type:
    pcStack_10 = "mpack_error_type";
    break;
  case mpack_error_too_big:
    pcStack_10 = "mpack_error_too_big";
    break;
  case mpack_error_memory:
    pcStack_10 = "mpack_error_memory";
    break;
  case mpack_error_bug:
    pcStack_10 = "mpack_error_bug";
    break;
  case mpack_error_data:
    pcStack_10 = "mpack_error_data";
    break;
  case mpack_error_eof:
    pcStack_10 = "mpack_error_eof";
  }
  return pcStack_10;
}

Assistant:

const char* mpack_error_to_string(mpack_error_t error) {
    #if MPACK_STRINGS
    switch (error) {
        #define MPACK_ERROR_STRING_CASE(e) case e: return #e
        MPACK_ERROR_STRING_CASE(mpack_ok);
        MPACK_ERROR_STRING_CASE(mpack_error_io);
        MPACK_ERROR_STRING_CASE(mpack_error_invalid);
        MPACK_ERROR_STRING_CASE(mpack_error_type);
        MPACK_ERROR_STRING_CASE(mpack_error_too_big);
        MPACK_ERROR_STRING_CASE(mpack_error_memory);
        MPACK_ERROR_STRING_CASE(mpack_error_bug);
        MPACK_ERROR_STRING_CASE(mpack_error_data);
        MPACK_ERROR_STRING_CASE(mpack_error_eof);
        #undef MPACK_ERROR_STRING_CASE
        default: break;
    }
    mpack_assert(0, "unrecognized error %i", (int)error);
    return "(unknown mpack_error_t)";
    #else
    MPACK_UNUSED(error);
    return "";
    #endif
}